

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

void __thiscall backend::codegen::RegAllocator::alloc_regs(RegAllocator *this)

{
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *this_00;
  Tag *this_01;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  element_type *peVar4;
  pointer puVar5;
  _Head_base<0UL,_arm::Inst_*,_false> _Var6;
  long lVar7;
  int iVar8;
  ostream *poVar9;
  _Rb_tree_node_base *p_Var10;
  Severity *pSVar11;
  const_iterator cVar12;
  ulong uVar13;
  Severity *in_RSI;
  char *pcVar14;
  Function *pFVar15;
  RegAllocator *pRVar16;
  int iVar17;
  Inst *pIVar18;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *this_02;
  Function *pFVar19;
  uint r;
  ostream local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  RegAllocator *local_120;
  undefined1 local_118 [32];
  Tag local_f8;
  _Head_base<0UL,_arm::Inst_*,_false> local_c8;
  string local_c0;
  undefined1 local_a0 [24];
  Function local_88;
  
  construct_reg_map(this);
  calc_live_intervals(this);
  local_123 = (ostream)0x0;
  AixLog::operator<<(&local_123,in_RSI);
  pcVar14 = "bb_reg_use";
  AixLog::Tag::Tag((Tag *)(local_118 + 0x20),"bb_reg_use");
  AixLog::operator<<((ostream *)(local_118 + 0x20),(Tag *)pcVar14);
  local_a0._8_8_ = std::chrono::_V2::system_clock::now();
  local_a0._0_8_ = &PTR__Timestamp_001d8f28;
  local_a0[0x10] = 0;
  AixLog::operator<<((ostream *)local_a0,(Timestamp *)pcVar14);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"alloc_regs",&local_121);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,&local_122);
  pFVar15 = (Function *)local_118;
  local_120 = this;
  AixLog::Function::Function(&local_88,(string *)pFVar15,&local_c0,0x11c);
  AixLog::operator<<((ostream *)&local_88,pFVar15);
  pcVar14 = "BB starting point";
  poVar9 = std::operator<<((ostream *)&std::clog,"BB starting point");
  std::endl<char,std::char_traits<char>>(poVar9);
  AixLog::Function::~Function(&local_88);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)local_118);
  this_01 = (Tag *)(local_118 + 0x20);
  AixLog::Tag::~Tag(this_01);
  local_c8._M_head_impl = (Inst *)&(local_120->point_bb_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = (local_120->point_bb_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pRVar16 = local_120, p_Var10 != (_Rb_tree_node_base *)local_c8._M_head_impl) {
    _Var3 = p_Var10[1]._M_color;
    pSVar11 = (Severity *)(ulong)*(uint *)&p_Var10[1].field_0x4;
    local_123 = (ostream)0x0;
    AixLog::operator<<(&local_123,(Severity *)pcVar14);
    pcVar14 = "bb_reg_use";
    AixLog::Tag::Tag(this_01,"bb_reg_use");
    AixLog::operator<<((ostream *)this_01,(Tag *)pcVar14);
    local_a0._8_8_ = std::chrono::_V2::system_clock::now();
    local_a0._0_8_ = &PTR__Timestamp_001d8f28;
    local_a0[0x10] = 0;
    AixLog::operator<<((ostream *)local_a0,(Timestamp *)pcVar14);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"alloc_regs",&local_121);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,&local_122);
    pFVar15 = (Function *)local_118;
    AixLog::Function::Function(&local_88,(string *)pFVar15,&local_c0,0x11e);
    AixLog::operator<<((ostream *)&local_88,pFVar15);
    poVar9 = (ostream *)std::ostream::operator<<(&std::clog,_Var3);
    poVar9 = std::operator<<(poVar9," -> ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    AixLog::Function::~Function(&local_88);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)local_118);
    AixLog::Tag::~Tag(this_01);
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    pcVar14 = (char *)pSVar11;
  }
  calc_reg_affinity(local_120);
  perform_load_stores(pRVar16);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::_M_move_assign(&pRVar16->f->inst,&pRVar16->inst_sink);
  local_c8._M_head_impl =
       *(Inst **)&(((pRVar16->f->inst).
                    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                  super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>;
  p_Var1 = &(pRVar16->used_regs)._M_t._M_impl.super__Rb_tree_header;
  this_00 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
             *)((long)local_c8._M_head_impl + 0x10);
  for (p_Var10 = (pRVar16->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != p_Var1;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    local_88._vptr_Function =
         (_func_int **)CONCAT44(local_88._vptr_Function._4_4_,p_Var10[1]._M_color);
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>(this_00,(uint *)&local_88);
  }
  p_Var2 = &(pRVar16->used_regs_temp)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var10 = (pRVar16->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != p_Var2;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    local_88._vptr_Function =
         (_func_int **)CONCAT44(local_88._vptr_Function._4_4_,p_Var10[1]._M_color);
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>(this_00,(uint *)&local_88);
  }
  pIVar18 = (pRVar16->f->inst).
            super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 1;
  for (p_Var10 = (pRVar16->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != p_Var1;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    local_88._vptr_Function =
         (_func_int **)CONCAT44(local_88._vptr_Function._4_4_,p_Var10[1]._M_color);
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)pIVar18,(uint *)&local_88);
  }
  for (p_Var10 = (local_120->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pRVar16 = local_120, (_Rb_tree_header *)p_Var10 != p_Var2;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    local_88._vptr_Function =
         (_func_int **)CONCAT44(local_88._vptr_Function._4_4_,p_Var10[1]._M_color);
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)pIVar18,(uint *)&local_88);
  }
  pFVar19 = local_120->f;
  peVar4 = (pFVar19->ty).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar13 = (long)*(pointer *)
                  ((long)&(peVar4->params).
                          super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                          ._M_impl.super__Vector_impl_data + 8) -
           (long)(peVar4->params).
                 super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = local_120->stack_size;
  iVar17 = (int)(*(long *)((long)(local_c8._M_head_impl + 3) + 8) << 2);
  if (uVar13 < 0x41 && iVar8 == 0) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
             *)this_00,&arm::REG_FP);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
             *)pIVar18,&arm::REG_FP);
    iVar8 = pRVar16->stack_size;
    if (iVar8 != 0) goto LAB_0015e424;
    pFVar19 = pRVar16->f;
LAB_0015e374:
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::erase(&pFVar19->inst,
            (pFVar19->inst).
            super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1);
LAB_0015e5cc:
    if (pRVar16->stack_size != 0) goto LAB_0015e5ec;
  }
  else {
    if (uVar13 < 0x41) {
      if (iVar8 == 0) goto LAB_0015e374;
LAB_0015e424:
      this_02 = &pRVar16->f->inst;
      cVar12._M_current =
           (pRVar16->f->inst).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2;
      local_88.name._M_dataplus._M_p._0_4_ = iVar8;
      if (iVar8 < 0x400) {
        local_c0._M_dataplus._M_p._0_4_ = 10;
        local_88.name.field_2._M_local_buf[0] = '\x01';
        local_88._vptr_Function = (_func_int **)&PTR_display_001db830;
        std::
        make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int_const&,unsigned_int_const&,arm::Operand2>
                  ((OpCode *)local_118,(uint *)&local_c0,&arm::REG_SP,(Operand2 *)&arm::REG_SP);
        local_f8._vptr_Tag = (_func_int **)local_118._0_8_;
        local_118._0_8_ =
             (__uniq_ptr_impl<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>)0x0;
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::_M_insert_rval(this_02,cVar12,(value_type *)(local_118 + 0x20));
        if (local_f8._vptr_Tag != (_func_int **)0x0) {
          (**(code **)(*local_f8._vptr_Tag + 0x10))();
        }
        local_f8._vptr_Tag = (_func_int **)0x0;
        std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
                  ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)local_118);
      }
      else {
        local_c0._M_dataplus._M_p._0_4_ = 6;
        local_a0._0_4_ = 0xc;
        local_88.name.field_2._M_local_buf[0] = '\x01';
        local_88._vptr_Function = (_func_int **)&PTR_display_001db830;
        std::make_unique<arm::Arith2Inst,arm::OpCode,int,arm::Operand2>
                  ((OpCode *)local_118,(int *)&local_c0,(Operand2 *)local_a0);
        local_f8._vptr_Tag = (_func_int **)local_118._0_8_;
        local_118._0_8_ = (Arith3Inst *)0x0;
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::_M_insert_rval(this_02,cVar12,(value_type *)(local_118 + 0x20));
        if (local_f8._vptr_Tag != (_func_int **)0x0) {
          (**(code **)(*local_f8._vptr_Tag + 0x10))();
        }
        local_f8._vptr_Tag = (_func_int **)0x0;
        std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
                  ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)local_118);
        pFVar19 = pRVar16->f;
        puVar5 = (pFVar19->inst).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_c0._M_dataplus._M_p._0_4_ = 10;
        local_88._vptr_Function = (_func_int **)&PTR_display_001db7d0;
        local_88.name._M_dataplus._M_p._0_4_ = 0xc;
        local_88.name._M_dataplus._M_p._4_2_ = 1;
        std::
        make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int_const&,unsigned_int_const&,arm::RegisterOperand>
                  ((OpCode *)local_118,(uint *)&local_c0,&arm::REG_SP,
                   (RegisterOperand *)&arm::REG_SP);
        local_f8._vptr_Tag = (_func_int **)local_118._0_8_;
        local_118._0_8_ =
             (__uniq_ptr_impl<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>)0x0;
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::_M_insert_rval(&pFVar19->inst,puVar5 + 3,(value_type *)(local_118 + 0x20));
        if (local_f8._vptr_Tag != (_func_int **)0x0) {
          (**(code **)(*local_f8._vptr_Tag + 0x10))();
        }
        local_f8._vptr_Tag = (_func_int **)0x0;
        std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
                  ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)local_118);
        pRVar16 = local_120;
      }
      goto LAB_0015e5cc;
    }
    puVar5 = (pFVar19->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_c0._M_dataplus._M_p._0_4_ = 9;
    local_88.name.field_2._M_local_buf[0] = '\x01';
    local_88._vptr_Function = (_func_int **)&PTR_display_001db830;
    local_88.name._M_dataplus._M_p._0_4_ = iVar17;
    std::
    make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int_const&,unsigned_int_const&,arm::Operand2>
              ((OpCode *)local_118,(uint *)&local_c0,&arm::REG_FP,(Operand2 *)&arm::REG_FP);
    local_f8._vptr_Tag = (_func_int **)local_118._0_8_;
    local_118._0_8_ = (Arith3Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_insert_rval(&pFVar19->inst,puVar5 + 2,(value_type *)(local_118 + 0x20));
    if (local_f8._vptr_Tag != (_func_int **)0x0) {
      (**(code **)(*local_f8._vptr_Tag + 0x10))();
    }
    local_f8._vptr_Tag = (_func_int **)0x0;
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)local_118);
    iVar8 = pRVar16->stack_size;
    if (iVar8 != 0) goto LAB_0015e424;
  }
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::erase(&pRVar16->f->inst,
          (pRVar16->f->inst).
          super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + -2);
LAB_0015e5ec:
  if (0x40 < uVar13) {
    pFVar19 = pRVar16->f;
    puVar5 = (pFVar19->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_c0._M_dataplus._M_p._0_4_ = 10;
    local_88.name.field_2._M_local_buf[0] = '\x01';
    local_88._vptr_Function = (_func_int **)&PTR_display_001db830;
    local_88.name._M_dataplus._M_p._0_4_ = iVar17;
    std::
    make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int_const&,unsigned_int_const&,arm::Operand2>
              ((OpCode *)local_118,(uint *)&local_c0,&arm::REG_FP,(Operand2 *)&arm::REG_FP);
    local_f8._vptr_Tag = (_func_int **)local_118._0_8_;
    local_118._0_8_ = (Arith3Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_insert_rval(&pFVar19->inst,puVar5 + -2,(value_type *)(local_118 + 0x20));
    if (local_f8._vptr_Tag != (_func_int **)0x0) {
      (**(code **)(*local_f8._vptr_Tag + 0x10))();
    }
    local_f8._vptr_Tag = (_func_int **)0x0;
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)local_118);
  }
  pFVar19 = pRVar16->f;
  cVar12._M_current =
       (pFVar19->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pIVar18 = ((cVar12._M_current)->_M_t).
            super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
  _Var6._M_head_impl =
       (pFVar19->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
       super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
  lVar7._0_4_ = pIVar18[3].op;
  lVar7._4_1_ = pIVar18[3].cond;
  lVar7._5_3_ = *(undefined3 *)&pIVar18[3].field_0xd;
  if (lVar7 == 0) {
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::erase(&pFVar19->inst,cVar12);
  }
  if (*(long *)((long)(_Var6._M_head_impl + 3) + 8) == 0) {
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::erase(&pRVar16->f->inst,
            (pRVar16->f->inst).
            super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1);
  }
  return;
}

Assistant:

void RegAllocator::alloc_regs() {
  construct_reg_map();
  calc_live_intervals();

  LOG(TRACE, "bb_reg_use") << "BB starting point" << std::endl;
  for (auto x : point_bb_map) {
    LOG(TRACE, "bb_reg_use") << x.first << " -> " << x.second << std::endl;
  }

  // LOG(TRACE, "bb_reg_use") << "BB Reg use:" << std::endl;
  // for (auto x : bb_used_regs) {
  //   LOG(TRACE, "bb_reg_use") << x.first << " -> ";
  //   for (auto r : x.second) {
  //     display_reg_name(LOG(TRACE, "color_map"), r);
  //     LOG(TRACE, "bb_reg_use") << " ";
  //   }
  //   LOG(TRACE, "bb_reg_use") << std::endl;
  // }
  calc_reg_affinity();

  perform_load_stores();
  f.inst = std::move(inst_sink);

  {
    // Add used reg stuff
    auto &first = f.inst.front();
    auto first_ = static_cast<PushPopInst *>(&*first);
    for (auto r : used_regs) first_->regs.insert(r);
    for (auto r : used_regs_temp) first_->regs.insert(r);
    auto &last = f.inst.back();
    auto last_ = static_cast<PushPopInst *>(&*last);
    for (auto r : used_regs) last_->regs.insert(r);
    for (auto r : used_regs_temp) last_->regs.insert(r);

    auto use_stack_param = f.ty.get()->params.size() > 4;
    auto offset_size = (first_->regs.size()) * 4;

    if (!use_stack_param && stack_size == 0) {
      first_->regs.erase(REG_FP);
      last_->regs.erase(REG_FP);
    }

    if (use_stack_param) {
      f.inst.insert(f.inst.begin() + 2,
                    std::make_unique<Arith3Inst>(OpCode::Add, REG_FP, REG_FP,
                                                 Operand2(offset_size)));
    }

    if (stack_size == 0) {
      // sp does not change.
      if (!use_stack_param) {
        // no need to use fp
        f.inst.erase(f.inst.begin() + 1);
      }
    } else if (stack_size < 1024) {
      f.inst.insert(f.inst.begin() + 2,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_SP, REG_SP,
                                                 Operand2(stack_size)));
    } else {
      f.inst.insert(
          f.inst.begin() + 2,
          std::make_unique<Arith2Inst>(OpCode::Mov, 12, Operand2(stack_size)));
      f.inst.insert(f.inst.begin() + 3,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_SP, REG_SP,
                                                 RegisterOperand(12)));
    }

    if (stack_size == 0) {
      // sp hasn't change throught function
      f.inst.erase(f.inst.end() - 2);
    }

    if (use_stack_param) {
      f.inst.insert(f.inst.end() - 2,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_FP, REG_FP,
                                                 Operand2(offset_size)));
    }
    {
      auto &first = f.inst.front();
      auto first_ = static_cast<PushPopInst *>(&*first);
      auto &last = f.inst.back();
      auto last_ = static_cast<PushPopInst *>(&*last);
      if (first_->regs.empty()) f.inst.erase(f.inst.begin());
      if (last_->regs.empty()) f.inst.erase(f.inst.end() - 1);
    }
  }
}